

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::BackgroundFindRoots(Recycler *this)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  size_t sVar6;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *node;
  GuestArenaAllocator *pGVar7;
  ArenaData *local_68;
  GuestArenaAllocator *allocator;
  EditingIterator guestArenaIter;
  size_t scanRootBytes;
  size_t lastMarkCount;
  Recycler *this_local;
  
  sVar1 = (this->collectionStats).markData.markCount;
  guestArenaIter.super_Iterator.current = (NodeBase *)0x0;
  BVar4 = IsConcurrentFindRootState(this);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f6,"(this->IsConcurrentFindRootState())",
                       "this->IsConcurrentFindRootState()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((this->hasPendingConcurrentFindRoot & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f7,"(this->hasPendingConcurrentFindRoot)",
                       "this->hasPendingConcurrentFindRoot");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((this->inPartialCollectMode & 1U) == 0) && (bVar3 = DoQueueTrackedObject(this), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f9,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                       "this->inPartialCollectMode || this->DoQueueTrackedObject()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  sVar6 = ScanPinnedObjects<true>(this);
  guestArenaIter.super_Iterator.current =
       (NodeBase *)((long)&(guestArenaIter.super_Iterator.current)->next + sVar6);
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::EditingIterator
            ((EditingIterator *)&allocator,&this->guestArenaList);
  while( true ) {
    if (guestArenaIter.super_Iterator.list ==
        (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pGVar7 = allocator;
    node = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                     (&(guestArenaIter.super_Iterator.list)->
                       super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    bVar3 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::IsHead
                      ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)pGVar7,node);
    if (bVar3) break;
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
         DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                   (&(guestArenaIter.super_Iterator.list)->
                     super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)&allocator);
    if ((pGVar7->pendingDelete & 1U) == 0) {
      local_68 = (ArenaData *)0x0;
      if (pGVar7 != (GuestArenaAllocator *)0x0) {
        local_68 = &(pGVar7->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_ArenaData;
      }
      sVar6 = ScanArena(this,local_68,true);
      guestArenaIter.super_Iterator.current =
           (NodeBase *)((long)&(guestArenaIter.super_Iterator.current)->next + sVar6);
    }
    else if ((this->hasPendingDeleteGuestArena & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1616,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  guestArenaIter.super_Iterator.list =
       (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
  ScanImplicitRoots(this);
  this->hasPendingConcurrentFindRoot = false;
  SetCollectionState(this,CollectionStateConcurrentMark);
  (this->collectionStats).rootCount =
       ((this->collectionStats).markData.markCount - sVar1) + (this->collectionStats).rootCount;
  return (size_t)guestArenaIter.super_Iterator.current;
}

Assistant:

size_t
Recycler::BackgroundFindRoots()
{
#ifdef RECYCLER_STATS
    size_t lastMarkCount = this->collectionStats.markData.markCount;
#endif

    size_t scanRootBytes = 0;
    Assert(this->IsConcurrentFindRootState());
    Assert(this->hasPendingConcurrentFindRoot);
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif

    // Only mark pinned object and guest arenas, which is where most of the roots are.
    // When we go back to the main thread to rescan, we will scan the rest of the root.

    // NOTE: purposefully not marking the transientPinnedObject there. as it is transient :)

    // background mark the pinned object. Since we are in concurrent find root state
    // the main thread won't delete any entries from the map, so concurrent read
    // to the map safe.

    GCETW(GC_BACKGROUNDSCANROOTS_START, (this));
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundFindRootsPhase);

    scanRootBytes += this->ScanPinnedObjects</*background = */true>();

    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::FindRootArenaPhase);
    // background mark the guest arenas. Since we are in concurrent find root state
    // the main thread won't delete any arena, so concurrent reads to them are ok.
    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
        if (allocator.pendingDelete)
        {
            // Skip guest arena that are already marked for delete
            Assert(this->hasPendingDeleteGuestArena);
            continue;
        }
        scanRootBytes += ScanArena(&allocator, true);
    }
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::FindRootArenaPhase);

    this->ScanImplicitRoots();

    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundFindRootsPhase);
    this->hasPendingConcurrentFindRoot = false;
    this->SetCollectionState(CollectionStateConcurrentMark);

    GCETW(GC_BACKGROUNDSCANROOTS_STOP, (this));
    RECYCLER_STATS_ADD(this, rootCount, this->collectionStats.markData.markCount - lastMarkCount);

    return scanRootBytes;
}